

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O3

bool __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Generator::generate(Generator *this)

{
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *this_00;
  uint uVar1;
  uint uVar2;
  Texture2DGradientTestCase *pTVar3;
  Texture2D *this_01;
  long lVar4;
  int levelNdx;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vec4 gMax;
  Vec4 gMin;
  TextureFormatInfo fmtInfo;
  Vec4 local_98;
  Vec4 local_88;
  TextureFormatInfo local_78;
  
  this_01 = (Texture2D *)operator_new(0x50);
  pTVar3 = this->m_testCase;
  tcu::Texture2D::Texture2D
            (this_01,&pTVar3->m_format,(pTVar3->m_dimensions).m_data[0],
             (pTVar3->m_dimensions).m_data[1]);
  local_78.valueMin.m_data[0] = 0.0;
  local_78.valueMin.m_data[1] = 0.0;
  this_00 = &this->m_tex;
  if ((this->m_tex).super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.ptr
      != this_01) {
    de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
              (&this_00->super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>);
    (this_00->super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>).m_data.ptr =
         this_01;
  }
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
            ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&local_78);
  pTVar3 = this->m_testCase;
  uVar1 = (pTVar3->m_dimensions).m_data[0];
  uVar2 = (pTVar3->m_dimensions).m_data[1];
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  tcu::getTextureFormatInfo(&local_78,&pTVar3->m_format);
  if (uVar2 != 0) {
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    fVar7 = (local_78.valueMax.m_data[0] - local_78.valueMin.m_data[0]) * 0.0 +
            local_78.valueMin.m_data[0];
    fVar8 = (local_78.valueMax.m_data[1] - local_78.valueMin.m_data[1]) * 0.0 +
            local_78.valueMin.m_data[1];
    fVar5 = (local_78.valueMax.m_data[0] - local_78.valueMin.m_data[0]) * 1.0 +
            local_78.valueMin.m_data[0];
    fVar6 = (local_78.valueMax.m_data[1] - local_78.valueMin.m_data[1]) * 1.0 +
            local_78.valueMin.m_data[1];
    levelNdx = 0;
    lVar4 = 0;
    do {
      local_88.m_data[1] = fVar8;
      local_88.m_data[0] = fVar7;
      local_88.m_data[3] =
           (local_78.valueMax.m_data[3] - local_78.valueMin.m_data[3]) * 1.0 +
           local_78.valueMin.m_data[3];
      local_88.m_data[2] =
           (local_78.valueMax.m_data[2] - local_78.valueMin.m_data[2]) * 0.0 +
           local_78.valueMin.m_data[2];
      local_98.m_data[1] = fVar6;
      local_98.m_data[0] = fVar5;
      local_98.m_data[3] =
           (local_78.valueMax.m_data[3] - local_78.valueMin.m_data[3]) * 0.0 +
           local_78.valueMin.m_data[3];
      local_98.m_data[2] =
           (local_78.valueMax.m_data[2] - local_78.valueMin.m_data[2]) * 1.0 +
           local_78.valueMin.m_data[2];
      tcu::Texture2D::allocLevel
                ((this_00->super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>).
                 m_data.ptr,levelNdx);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 ((long)(((this_00->
                          super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>).
                          m_data.ptr)->super_TextureLevelPyramid).m_access.
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar4),&local_88,&local_98);
      lVar4 = lVar4 + 0x28;
      levelNdx = levelNdx + 1;
    } while ((ulong)((uVar1 ^ 0xffffffe0) + 0x21 + (uint)((uVar1 ^ 0xffffffe0) == 0xffffffdf)) *
             0x28 != lVar4);
  }
  return true;
}

Assistant:

virtual bool generate (void)
	{
		m_tex = de::MovePtr<Texture2D>(new Texture2D(m_testCase->m_format,
													 m_testCase->m_dimensions[0],
													 m_testCase->m_dimensions[1]));

		const deUint8 numLevels = (deUint8) (1 + deLog2Floor32(de::max(m_testCase->m_dimensions[0],
																	   m_testCase->m_dimensions[1])));

		const TextureFormatInfo fmtInfo = getTextureFormatInfo(m_testCase->m_format);

		const Vec4 cBias  = fmtInfo.valueMin;
		const Vec4 cScale = fmtInfo.valueMax - fmtInfo.valueMin;

		for (deUint8 levelNdx = 0; levelNdx < numLevels; ++levelNdx)
		{
			const Vec4 gMin = Vec4(0.0f, 0.0f, 0.0f, 1.0f) * cScale + cBias;
			const Vec4 gMax = Vec4(1.0f, 1.0f, 1.0f, 0.0f) * cScale + cBias;

			m_tex->allocLevel(levelNdx);
			fillWithComponentGradients(m_tex->getLevel(levelNdx), gMin, gMax);
		}

		return true;
	}